

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_fileno_op(sexp ctx,sexp self,sexp_sint_t n,sexp fd,sexp no_closep)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sexp in_RCX;
  sexp in_RDX;
  long in_RDI;
  sexp in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  undefined1 *local_48;
  sexp_uint_t tag;
  sexp obj;
  sexp local_8;
  
  obj = (sexp)&DAT_0000043e;
  memset(&local_48,0,0x10);
  if (((ulong)in_RCX & 1) == 1) {
    auVar1._8_8_ = (long)in_RCX >> 0x3f;
    auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
    if (SUB168(auVar1 / SEXT816(2),0) < 0) {
      local_8 = (sexp)&DAT_0000003e;
    }
    else {
      local_48 = &stack0xffffffffffffffc8;
      tag = *(sexp_uint_t *)(in_RDI + 0x6080);
      *(undefined1 ***)(in_RDI + 0x6080) = &local_48;
      local_8 = sexp_alloc_tagged_aux(in_R8,(size_t)obj,tag);
      if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
        auVar2._8_8_ = (long)in_RCX >> 0x3f;
        auVar2._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
        (local_8->value).string.offset = SUB168(auVar2 / SEXT816(2),0);
        (local_8->value).flonum_bits[0] = '\x01';
        (local_8->value).flonum_bits[1] = in_R8 != (sexp)&DAT_0000003e;
      }
      *(sexp_uint_t *)(in_RDI + 0x6080) = tag;
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,obj);
  }
  return local_8;
}

Assistant:

sexp sexp_make_fileno_op (sexp ctx, sexp self, sexp_sint_t n, sexp fd, sexp no_closep) {
  sexp_gc_var1(res);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, fd);
  if (sexp_unbox_fixnum(fd) < 0) return SEXP_FALSE;
#if SEXP_USE_UNIFY_FILENOS_BY_NUMBER
  res = sexp_lookup_fileno(ctx, sexp_unbox_fixnum(fd));
  if (sexp_filenop(res)) {
    sexp_fileno_no_closep(res) = sexp_truep(no_closep);
    sexp_fileno_openp(res) = 1;  /* not necessarily */
    return res;
  }
#endif
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_type(ctx, fileno, SEXP_FILENO);
  if (!sexp_exceptionp(res)) {
    sexp_fileno_fd(res) = sexp_unbox_fixnum(fd);
    sexp_fileno_openp(res) = 1;
    sexp_fileno_no_closep(res) = sexp_truep(no_closep);
#if SEXP_USE_UNIFY_FILENOS_BY_NUMBER
    sexp_insert_fileno(ctx, res);
#endif
  }
  sexp_gc_release1(ctx);
  return res;
}